

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

Aig_Man_t * Gia_ManToAigSkip(Gia_Man_t *p,int nOutDelta)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t **ppNodes;
  Gia_Obj_t *pGVar4;
  Aig_Obj_t *pAVar5;
  uint v;
  
  if ((p->pNexts != (int *)0x0) || (p->pReprs != (Gia_Rpr_t *)0x0)) {
    __assert_fail("p->pNexts == NULL && p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                  ,0x14b,"Aig_Man_t *Gia_ManToAigSkip(Gia_Man_t *, int)");
  }
  if ((nOutDelta < 1) || (p->vCos->nSize % nOutDelta != 0)) {
    __assert_fail("nOutDelta > 0 && Gia_ManCoNum(p) % nOutDelta == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                  ,0x14c,"Aig_Man_t *Gia_ManToAigSkip(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManAndNum(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p_00->nConstrs = p->nConstrs;
  ppNodes = (Aig_Obj_t **)calloc((long)p->nObjs,8);
  *ppNodes = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCi(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pAVar5 = Aig_ObjCreateCi(p_00);
    iVar2 = Gia_ObjId(p,pGVar4);
    ppNodes[iVar2] = pAVar5;
  }
  for (v = 0; (int)v < p->vCos->nSize; v = v + 1) {
    pGVar4 = Gia_ManCo(p,v);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ManToAig_rec(p_00,ppNodes,p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
    if (v % (uint)nOutDelta == 0) {
      iVar1 = Gia_ObjId(p,pGVar4);
      pAVar5 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                    ((ulong)(*(uint *)pGVar4 >> 0x1d & 1) ^
                                    (ulong)ppNodes[(int)(iVar1 - (*(uint *)pGVar4 & 0x1fffffff))]));
      iVar1 = Gia_ObjId(p,pGVar4);
      ppNodes[iVar1] = pAVar5;
    }
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  free(ppNodes);
  return p_00;
}

Assistant:

Aig_Man_t * Gia_ManToAigSkip( Gia_Man_t * p, int nOutDelta )
{
    Aig_Man_t * pNew;
    Aig_Obj_t ** ppNodes;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pNexts == NULL && p->pReprs == NULL );
    assert( nOutDelta > 0 && Gia_ManCoNum(p) % nOutDelta == 0 );
    // create the new manager
    pNew = Aig_ManStart( Gia_ManAndNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
//    pNew->pSpec = Abc_UtilStrsav( p->pName );
    // create the PIs
    ppNodes = ABC_CALLOC( Aig_Obj_t *, Gia_ManObjNum(p) );
    ppNodes[0] = Aig_ManConst0(pNew);
    Gia_ManForEachCi( p, pObj, i )
        ppNodes[Gia_ObjId(p, pObj)] = Aig_ObjCreateCi( pNew );
    // add logic for the POs
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManToAig_rec( pNew, ppNodes, p, Gia_ObjFanin0(pObj) );        
        if ( i % nOutDelta != 0 )
            continue;
        ppNodes[Gia_ObjId(p, pObj)] = Aig_ObjCreateCo( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
    }
    Aig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( ppNodes );
    return pNew;
}